

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_connect_common(connectdata *conn,int sockindex,_Bool nonblocking,_Bool *done)

{
  SSL *ssl;
  proxy_info *ppVar1;
  _Bool _Var2;
  int iVar3;
  curl_proxytype cVar4;
  CURLcode CVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  time_t tVar10;
  SSL_CIPHER *c;
  char *pcVar11;
  uint *puVar12;
  SSL_METHOD *meth;
  SSL_CTX *pSVar13;
  ulong uVar14;
  SSL_SESSION *ses;
  BIO_METHOD *pBVar15;
  stack_st_X509 *psVar16;
  Curl_easy *pCVar17;
  X509_NAME *pXVar18;
  size_t sVar19;
  undefined8 uVar20;
  ASN1_INTEGER *pAVar21;
  ASN1_STRING *pAVar22;
  X509_EXTENSION *ex;
  BIO *pBVar23;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  ulong uVar24;
  ASN1_TIME *pAVar25;
  EVP_PKEY *pkey;
  X509 *pXVar26;
  GENERAL_NAMES *a_00;
  int *piVar27;
  Curl_easy *pCVar28;
  undefined8 extraout_RAX;
  size_t sVar29;
  X509_NAME_ENTRY *ne;
  void *__src;
  OCSP_RESPONSE *resp;
  FILE *fp;
  X509 *pXVar30;
  X509_PUBKEY *pXVar31;
  uchar *pubkey;
  OCSP_BASICRESP *bs;
  X509_STORE *st;
  OCSP_SINGLERESP *single;
  long lVar32;
  undefined7 uVar33;
  curl_socket_t writefd;
  undefined7 in_register_00000011;
  size_t size;
  size_t size_00;
  long lVar34;
  char *pcVar35;
  long lVar36;
  long lVar37;
  curl_socket_t readfd0;
  long lVar38;
  long lVar39;
  X509_ALGOR *bn;
  long lVar40;
  int iVar41;
  ssl_connect_state sVar42;
  char cVar43;
  long lVar44;
  bool bVar45;
  CURLcode CStack_ba0;
  char *ptr;
  Curl_easy *local_b70;
  undefined8 local_b68;
  undefined8 local_b60;
  Curl_easy *local_b58;
  Curl_easy *local_b50;
  BIO *local_b48;
  X509 *x509;
  Curl_easy *local_b38;
  EVP_PKEY *local_b28;
  long local_b20;
  X509 *local_b10;
  stack_st_X509 *local_b08;
  Curl_easy *local_b00;
  X509_ALGOR *palg;
  in_addr addr;
  char *local_ac0;
  anon_struct_16_2_531ec2c5 params;
  char error_buffer [256];
  char error_buffer_1 [256];
  
  lVar44 = (long)sockindex;
  if (conn->ssl[lVar44].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  local_b50 = (Curl_easy *)CONCAT44(local_b50._4_4_,sockindex);
  pCVar28 = conn->data;
  local_b48 = (BIO *)CONCAT44(local_b48._4_4_,conn->sock[lVar44]);
  sVar42 = conn->ssl[lVar44].connecting_state;
  if (sVar42 == ssl_connect_1) {
    tVar10 = Curl_timeleft(pCVar28,(timeval *)0x0,true);
    if (-1 < tVar10) {
      pCVar17 = conn->data;
      local_b58 = (Curl_easy *)
                  CONCAT44(local_b58._4_4_,(int)CONCAT71(in_register_00000011,nonblocking));
      if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        local_b10 = (X509 *)(conn->http_proxy).host.name;
        lVar34 = 0x520;
        lVar37 = 0x398;
        lVar32 = 0x3a0;
        lVar40 = 0x550;
        lVar38 = 0x548;
        lVar39 = 0x380;
        lVar36 = 0x518;
      }
      else {
        local_b10 = (X509 *)(conn->host).name;
        lVar34 = 0x470;
        lVar37 = 0x348;
        lVar32 = 0x350;
        lVar40 = 0x4a0;
        lVar38 = 0x498;
        lVar39 = 0x330;
        lVar36 = 0x468;
      }
      local_b70 = (Curl_easy *)CONCAT44(local_b70._4_4_,conn->sock[lVar44]);
      local_b08 = *(stack_st_X509 **)((conn->chunk).hexbuffer + lVar37 + -0x20);
      local_b68 = *(undefined8 *)((long)pCVar17->sockets + lVar40 + -0x80);
      uVar14 = *(ulong *)((conn->chunk).hexbuffer + lVar39 + -0x20);
      local_b60 = *(undefined8 *)((long)pCVar17->sockets + lVar38 + -0x80);
      local_b28 = *(EVP_PKEY **)((conn->chunk).hexbuffer + lVar32 + -0x20);
      uVar20 = *(undefined8 *)((long)pCVar17->sockets + lVar34 + -0x80);
      local_b38 = pCVar28;
      local_b00 = (Curl_easy *)(lVar44 * 0x28);
      CVar5 = Curl_ossl_seed(pCVar17);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      *(undefined8 *)((long)pCVar17->sockets + lVar36 + -0x80) = 1;
      local_b20 = uVar20;
      if (7 < uVar14) {
        Curl_failf(pCVar17,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
        return CURLE_SSL_CONNECT_ERROR;
      }
      if ((0xf3UL >> (uVar14 & 0x3f) & 1) != 0) {
        meth = (SSL_METHOD *)TLS_client_method();
        pSVar13 = (SSL_CTX *)conn->ssl[lVar44].ctx;
        if (pSVar13 != (SSL_CTX *)0x0) {
          SSL_CTX_free(pSVar13);
        }
        pSVar13 = SSL_CTX_new(meth);
        conn->ssl[lVar44].ctx = (SSL_CTX *)pSVar13;
        if (pSVar13 != (SSL_CTX *)0x0) {
          SSL_CTX_ctrl(pSVar13,0x21,0x10,(void *)0x0);
          if (((pCVar17->set).fdebug != (curl_debug_callback)0x0) &&
             ((pCVar17->set).verbose == true)) {
            SSL_CTX_set_msg_callback((SSL_CTX *)conn->ssl[lVar44].ctx,ssl_tls_trace);
            SSL_CTX_ctrl((SSL_CTX *)conn->ssl[lVar44].ctx,0x10,0,conn);
          }
          CVar5 = (*(code *)(&DAT_0055edf4 + *(int *)(&DAT_0055edf4 + uVar14 * 4)))();
          return CVar5;
        }
        uVar14 = ERR_peek_error();
        ERR_error_string_n(uVar14,error_buffer,0x100);
        Curl_failf(pCVar17,"SSL: couldn\'t create a context: %s",error_buffer);
        return CURLE_OUT_OF_MEMORY;
      }
      if (uVar14 == 2) {
        pcVar35 = "OpenSSL was built without SSLv2 support";
      }
      else {
        pcVar35 = "OpenSSL was built without SSLv3 support";
      }
      Curl_failf(pCVar17,pcVar35);
      return CURLE_NOT_BUILT_IN;
    }
LAB_004d93e8:
    Curl_failf(pCVar28,"SSL connection timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  local_b60 = CONCAT44(local_b60._4_4_,0x23);
  while (sVar42 - ssl_connect_2 < 3) {
    tVar10 = Curl_timeleft(pCVar28,(timeval *)0x0,true);
    if (tVar10 < 0) goto LAB_004d93e8;
    sVar42 = conn->ssl[lVar44].connecting_state;
    if ((sVar42 & ~ssl_connect_2) == ssl_connect_2_reading) {
      writefd = -1;
      if (sVar42 == ssl_connect_2_writing) {
        writefd = (curl_socket_t)local_b48;
      }
      readfd0 = -1;
      if (sVar42 == ssl_connect_2_reading) {
        readfd0 = (curl_socket_t)local_b48;
      }
      if (nonblocking) {
        tVar10 = 0;
      }
      iVar3 = Curl_socket_check(readfd0,-1,writefd,tVar10);
      if (iVar3 < 0) {
        puVar12 = (uint *)__errno_location();
        Curl_failf(pCVar28,"select/poll on SSL socket, errno: %d",(ulong)*puVar12);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if (iVar3 == 0) {
        if (nonblocking) {
          *done = false;
          return CURLE_OK;
        }
        goto LAB_004d93e8;
      }
    }
    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
       (lVar34 = 0x518, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar34 = 0x468;
    }
    pCVar17 = conn->data;
    ERR_clear_error();
    iVar3 = SSL_connect((SSL *)conn->ssl[lVar44].handle);
    if (iVar3 == 1) {
      conn->ssl[lVar44].connecting_state = ssl_connect_3;
      ssl = (SSL *)conn->ssl[lVar44].handle;
      pcVar35 = "";
      if (ssl != (SSL *)0x0) {
        iVar3 = SSL_version(ssl);
        pcVar35 = "TLSv1.3";
        switch(iVar3) {
        case 0x300:
          pcVar35 = "SSLv3";
          break;
        case 0x301:
          pcVar35 = "TLSv1.0";
          break;
        case 0x302:
          pcVar35 = "TLSv1.1";
          break;
        case 0x303:
          pcVar35 = "TLSv1.2";
          break;
        case 0x304:
          break;
        default:
          if (iVar3 == 2) {
            pcVar35 = "SSLv2";
          }
          else {
            pcVar35 = "unknown";
          }
        }
      }
      c = SSL_get_current_cipher((SSL *)conn->ssl[lVar44].handle);
      pcVar11 = SSL_CIPHER_get_name(c);
      Curl_infof(pCVar17,"SSL connection using %s / %s\n",pcVar35,pcVar11);
      if ((conn->bits).tls_enable_alpn == true) {
        SSL_get0_alpn_selected(conn->ssl[lVar44].handle,error_buffer_1,error_buffer);
        if (error_buffer._0_4_ == 0) {
          Curl_infof(pCVar17,"ALPN, server did not agree to a protocol\n");
        }
        else {
          Curl_infof(pCVar17,"ALPN, server accepted to use %.*s\n",error_buffer._0_8_ & 0xffffffff,
                     error_buffer_1._0_8_);
          if ((error_buffer._0_4_ == 8) && (*(long *)error_buffer_1._0_8_ == 0x312e312f70747468)) {
            conn->negnpn = 2;
          }
        }
      }
    }
    else {
      iVar3 = SSL_get_error((SSL *)conn->ssl[lVar44].handle,iVar3);
      if (iVar3 == 3) {
        conn->ssl[lVar44].connecting_state = ssl_connect_2_writing;
      }
      else {
        if (iVar3 != 2) {
          memset(error_buffer_1,0,0x100);
          conn->ssl[lVar44].connecting_state = ssl_connect_2;
          uVar14 = ERR_get_error();
          uVar8 = (uint)uVar14;
          if (((-1 < (int)uVar8) && ((uVar8 & 0xff800000) == 0xa000000)) &&
             ((uVar8 & 0x7fffff) == 0x86)) {
            lVar44 = SSL_get_verify_result((SSL *)conn->ssl[lVar44].handle);
            if (lVar44 == 0) {
              builtin_strncpy(error_buffer_1,"SSL certificate verification failed",0x24);
            }
            else {
              *(long *)((long)pCVar17->sockets + lVar34 + -0x80) = lVar44;
              pcVar35 = X509_verify_cert_error_string(lVar44);
              curl_msnprintf(error_buffer_1,0x100,"SSL certificate problem: %s",pcVar35);
            }
            CVar5 = CURLE_SSL_CACERT;
LAB_004d9992:
            Curl_failf(pCVar17,"%s",error_buffer_1);
            return CVar5;
          }
          ERR_error_string_n(uVar14,error_buffer_1,0x100);
          if (uVar14 != 0) {
            CVar5 = CURLE_SSL_CONNECT_ERROR;
            goto LAB_004d9992;
          }
          if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
            bVar45 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
            ppVar1 = &conn->http_proxy;
            if (bVar45) {
              ppVar1 = (proxy_info *)&conn->host;
            }
            pcVar35 = (ppVar1->host).name;
            if (!bVar45) {
              lVar44 = conn->port;
              goto LAB_004daaa1;
            }
          }
          else {
            pcVar35 = (conn->host).name;
          }
          lVar44 = (long)conn->remote_port;
LAB_004daaa1:
          pcVar11 = SSL_ERROR_to_str(iVar3);
          Curl_failf(pCVar17,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar11,pcVar35,
                     lVar44);
          return CURLE_SSL_CONNECT_ERROR;
        }
        conn->ssl[lVar44].connecting_state = ssl_connect_2_reading;
      }
    }
    sVar42 = conn->ssl[lVar44].connecting_state;
    if ((nonblocking) && (sVar42 - ssl_connect_2 < 3)) {
      return CURLE_OK;
    }
  }
  if (sVar42 == ssl_connect_3) {
    pCVar28 = conn->data;
    cVar4 = (conn->http_proxy).proxytype;
    if ((cVar4 == CURLPROXY_HTTPS) &&
       (iVar3 = conn->sock[1], conn->proxy_ssl[iVar3 != -1].state != ssl_connection_complete)) {
      if ((pCVar28->set).proxy_ssl.primary.sessionid != false) {
LAB_004d97ae:
        error_buffer_1[0] = '\0';
        error_buffer_1[1] = '\0';
        error_buffer_1[2] = '\0';
        error_buffer_1[3] = '\0';
        error_buffer_1[4] = '\0';
        error_buffer_1[5] = '\0';
        error_buffer_1[6] = '\0';
        error_buffer_1[7] = '\0';
        ses = SSL_get1_session((SSL *)conn->ssl[lVar44].handle);
        Curl_ssl_sessionid_lock(conn);
        _Var2 = Curl_ssl_getsessionid(conn,(void **)error_buffer_1,(size_t *)0x0,(int)local_b50);
        if ((_Var2) || ((SSL_SESSION *)error_buffer_1._0_8_ == ses)) {
          if (_Var2) goto LAB_004d981f;
          SSL_SESSION_free(ses);
        }
        else {
          Curl_infof(pCVar28,"old SSL session ID is stale, removing\n");
          Curl_ssl_delsessionid(conn,(void *)error_buffer_1._0_8_);
LAB_004d981f:
          CVar5 = Curl_ssl_addsessionid(conn,ses,0,(int)local_b50);
          if (CVar5 != CURLE_OK) {
            Curl_ssl_sessionid_unlock(conn);
            Curl_failf(pCVar28,"failed to store ssl session");
            return CVar5;
          }
        }
        Curl_ssl_sessionid_unlock(conn);
        cVar4 = (conn->http_proxy).proxytype;
        goto LAB_004d9a22;
      }
LAB_004d9a32:
      if (conn->proxy_ssl[iVar3 != -1].state == ssl_connection_complete) goto LAB_004d9a4a;
      if ((conn->proxy_ssl_config).verifypeer == true) {
        pCVar28 = conn->data;
        local_b20 = 0x518;
        goto LAB_004d9a89;
      }
      cVar43 = (conn->proxy_ssl_config).verifyhost;
      pCVar28 = conn->data;
      local_b20 = 0x518;
    }
    else {
      if ((pCVar28->set).ssl.primary.sessionid == true) goto LAB_004d97ae;
LAB_004d9a22:
      if (cVar4 == CURLPROXY_HTTPS) {
        iVar3 = conn->sock[1];
        goto LAB_004d9a32;
      }
LAB_004d9a4a:
      if ((conn->ssl_config).verifypeer == true) {
        pCVar28 = conn->data;
        local_b20 = 0x468;
LAB_004d9a89:
        cVar43 = '\x01';
      }
      else {
        cVar43 = (conn->ssl_config).verifyhost;
        pCVar28 = conn->data;
        local_b20 = 0x468;
      }
    }
    pBVar15 = BIO_s_mem();
    local_b10 = (X509 *)BIO_new(pBVar15);
    if ((pCVar28->set).ssl.certinfo == true) {
      pCVar17 = conn->data;
      psVar16 = SSL_get_peer_cert_chain((SSL *)conn->ssl[lVar44].handle);
      if (psVar16 != (stack_st_X509 *)0x0) {
        iVar3 = OPENSSL_sk_num(psVar16);
        local_b68 = CONCAT44(local_b68._4_4_,iVar3);
        CVar5 = Curl_ssl_init_certinfo(pCVar17,iVar3);
        if (CVar5 == CURLE_OK) {
          local_b38 = (Curl_easy *)CONCAT71(local_b38._1_7_,cVar43);
          local_b70 = pCVar28;
          local_b00 = pCVar17;
          pBVar15 = BIO_s_mem();
          local_b48 = BIO_new(pBVar15);
          iVar3 = (int)local_b68;
          if ((int)local_b68 < 1) {
            iVar3 = 0;
          }
          local_b68 = CONCAT44(local_b68._4_4_,iVar3);
          local_b08 = psVar16;
          for (iVar6 = 0; iVar6 != iVar3; iVar6 = iVar6 + 1) {
            pCVar17 = (Curl_easy *)OPENSSL_sk_value(local_b08,iVar6);
            _addr = (int *)0x0;
            pXVar18 = X509_get_subject_name((X509 *)pCVar17);
            pBVar23 = local_b48;
            X509_NAME_print_ex(local_b48,pXVar18,0,0x82031f);
            sVar19 = BIO_ctrl(pBVar23,3,0,&ptr);
            pCVar28 = local_b00;
            Curl_ssl_push_certinfo_len(local_b00,iVar6,"Subject",ptr,sVar19);
            BIO_ctrl(pBVar23,1,0,(void *)0x0);
            pXVar18 = X509_get_issuer_name((X509 *)pCVar17);
            X509_NAME_print_ex(pBVar23,pXVar18,0,0x82031f);
            sVar19 = BIO_ctrl(pBVar23,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar28,iVar6,"Issuer",ptr,sVar19);
            BIO_ctrl(pBVar23,1,0,(void *)0x0);
            uVar20 = X509_get_version(pCVar17);
            BIO_printf(pBVar23,"%lx",uVar20);
            sVar19 = BIO_ctrl(pBVar23,3,0,&ptr);
            local_b50 = (Curl_easy *)CONCAT44(local_b50._4_4_,iVar6);
            Curl_ssl_push_certinfo_len(pCVar28,iVar6,"Version",ptr,sVar19);
            BIO_ctrl(pBVar23,1,0,(void *)0x0);
            local_b58 = pCVar17;
            pAVar21 = X509_get_serialNumber((X509 *)pCVar17);
            if (pAVar21->type == 0x102) {
              BIO_puts(local_b48,"-");
            }
            for (lVar34 = 0; pBVar23 = local_b48, lVar34 < pAVar21->length; lVar34 = lVar34 + 1) {
              BIO_printf(local_b48,"%02x",(ulong)pAVar21->data[lVar34]);
            }
            sVar19 = BIO_ctrl(local_b48,3,0,&ptr);
            pCVar28 = local_b00;
            Curl_ssl_push_certinfo_len(local_b00,(int)local_b50,"Serial Number",ptr,sVar19);
            BIO_ctrl(pBVar23,1,0,(void *)0x0);
            palg = (X509_ALGOR *)0x0;
            pAVar22 = ASN1_STRING_new();
            if (pAVar22 != (ASN1_STRING *)0x0) {
              X509_get0_signature(&addr,&palg,local_b58);
              X509_signature_print(pBVar23,(X509_ALGOR *)palg,pAVar22);
              ASN1_STRING_free(pAVar22);
              if (palg != (X509_ALGOR *)0x0) {
                i2a_ASN1_OBJECT(pBVar23,(ASN1_OBJECT *)palg->algorithm);
                sVar19 = BIO_ctrl(pBVar23,3,0,&ptr);
                Curl_ssl_push_certinfo_len(pCVar28,(int)local_b50,"Public Key Algorithm",ptr,sVar19)
                ;
                BIO_ctrl(pBVar23,1,0,(void *)0x0);
              }
            }
            uVar20 = X509_get0_extensions(local_b58);
            iVar3 = OPENSSL_sk_num(uVar20);
            if (0 < iVar3) {
              for (iVar3 = 0; iVar6 = OPENSSL_sk_num(uVar20), iVar3 < iVar6; iVar3 = iVar3 + 1) {
                ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar20,iVar3);
                pBVar15 = BIO_s_mem();
                pBVar23 = BIO_new(pBVar15);
                if (pBVar23 == (BIO *)0x0) break;
                a = X509_EXTENSION_get_object(ex);
                i2t_ASN1_OBJECT((char *)&params,0x80,a);
                iVar6 = X509V3_EXT_print(pBVar23,ex,0,0);
                if (iVar6 == 0) {
                  v = X509_EXTENSION_get_data(ex);
                  ASN1_STRING_print(pBVar23,v);
                }
                BIO_ctrl(pBVar23,0x73,0,&x509);
                pcVar35 = error_buffer;
                uVar14 = 0;
                while (pCVar28 = local_b00, uVar24 = *(ulong *)x509, uVar14 < uVar24) {
                  bVar45 = *(char *)(*(long *)(x509 + 8) + uVar14) == '\n';
                  pcVar11 = "";
                  if (bVar45) {
                    pcVar11 = ", ";
                  }
                  uVar14 = uVar14 + bVar45;
                  if (uVar24 <= uVar14) {
                    uVar24 = uVar14;
                  }
                  for (; uVar24 != uVar14; uVar14 = uVar14 + 1) {
                    if (*(char *)(*(long *)(x509 + 8) + uVar14) != ' ') {
                      iVar6 = curl_msnprintf(pcVar35,(size_t)(error_buffer_1 + -(long)pcVar35),
                                             "%s%c",pcVar11);
                      pcVar35 = pcVar35 + iVar6;
                      uVar24 = uVar14;
                      break;
                    }
                  }
                  uVar14 = uVar24 + 1;
                }
                Curl_ssl_push_certinfo(local_b00,(int)local_b50,(char *)&params,error_buffer);
                BIO_free(pBVar23);
              }
            }
            pCVar17 = local_b58;
            pAVar25 = (ASN1_TIME *)X509_get0_notBefore(local_b58);
            pBVar23 = local_b48;
            ASN1_TIME_print(local_b48,pAVar25);
            sVar19 = BIO_ctrl(pBVar23,3,0,&ptr);
            iVar3 = (int)local_b50;
            Curl_ssl_push_certinfo_len(pCVar28,(int)local_b50,"Start date",ptr,sVar19);
            BIO_ctrl(pBVar23,1,0,(void *)0x0);
            pAVar25 = (ASN1_TIME *)X509_get0_notAfter(pCVar17);
            ASN1_TIME_print(pBVar23,pAVar25);
            sVar19 = BIO_ctrl(pBVar23,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar28,iVar3,"Expire date",ptr,sVar19);
            BIO_ctrl(pBVar23,1,0,(void *)0x0);
            pkey = X509_get_pubkey((X509 *)pCVar17);
            if (pkey == (EVP_PKEY *)0x0) {
              Curl_infof(pCVar28,"   Unable to load public key\n");
            }
            else {
              iVar3 = EVP_PKEY_get_id(pkey);
              if (iVar3 == 0x74) {
                uVar20 = EVP_PKEY_get0_DSA(pkey);
                local_b28 = pkey;
                DSA_get0_pqg(uVar20,error_buffer,&params,&x509);
                DSA_get0_key(uVar20,&palg,0);
                pBVar23 = local_b48;
                iVar3 = (int)local_b50;
                pubkey_show(pCVar28,(BIO *)local_b48,(int)local_b50,"dsa","p",
                            (BIGNUM *)error_buffer._0_8_);
                pubkey_show(pCVar28,(BIO *)pBVar23,iVar3,"dsa","q",(BIGNUM *)params.cert_id);
                pubkey_show(pCVar28,(BIO *)pBVar23,iVar3,"dsa","g",(BIGNUM *)x509);
                pcVar35 = "dsa";
LAB_004da2ad:
                pcVar11 = "pub_key";
                bn = palg;
LAB_004da2b4:
                pkey = local_b28;
                pubkey_show(pCVar28,(BIO *)pBVar23,iVar3,pcVar35,pcVar11,(BIGNUM *)bn);
              }
              else {
                if (iVar3 == 0x1c) {
                  uVar20 = EVP_PKEY_get0_DH(pkey);
                  local_b28 = pkey;
                  DH_get0_pqg(uVar20,error_buffer,&params,&x509);
                  DH_get0_key(uVar20,&palg,0);
                  pBVar23 = local_b48;
                  iVar3 = (int)local_b50;
                  pubkey_show(pCVar28,(BIO *)local_b48,(int)local_b50,"dh","p",
                              (BIGNUM *)error_buffer._0_8_);
                  pubkey_show(pCVar28,(BIO *)pBVar23,iVar3,"dh","q",(BIGNUM *)params.cert_id);
                  pubkey_show(pCVar28,(BIO *)pBVar23,iVar3,"dh","g",(BIGNUM *)x509);
                  pcVar35 = "dh";
                  goto LAB_004da2ad;
                }
                if (iVar3 == 6) {
                  uVar20 = EVP_PKEY_get0_RSA(pkey);
                  RSA_get0_key(uVar20,error_buffer,&params,0);
                  pBVar23 = local_b48;
                  local_b28 = pkey;
                  BN_print(local_b48,(BIGNUM *)error_buffer._0_8_);
                  sVar19 = BIO_ctrl(pBVar23,3,0,&ptr);
                  iVar3 = (int)local_b50;
                  Curl_ssl_push_certinfo_len(pCVar28,(int)local_b50,"RSA Public Key",ptr,sVar19);
                  BIO_ctrl(pBVar23,1,0,(void *)0x0);
                  pubkey_show(pCVar28,(BIO *)pBVar23,iVar3,"rsa","n",(BIGNUM *)error_buffer._0_8_);
                  pcVar35 = "rsa";
                  pcVar11 = "e";
                  bn = (X509_ALGOR *)params.cert_id;
                  goto LAB_004da2b4;
                }
              }
              EVP_PKEY_free(pkey);
            }
            if (_addr != (int *)0x0) {
              for (lVar34 = 0; pBVar23 = local_b48, lVar34 < *_addr; lVar34 = lVar34 + 1) {
                BIO_printf(local_b48,"%02x:",(ulong)*(byte *)(*(long *)(_addr + 2) + lVar34));
              }
              sVar19 = BIO_ctrl(local_b48,3,0,&ptr);
              Curl_ssl_push_certinfo_len(pCVar28,(int)local_b50,"Signature",ptr,sVar19);
              BIO_ctrl(pBVar23,1,0,(void *)0x0);
            }
            pBVar23 = local_b48;
            PEM_write_bio_X509(local_b48,(X509 *)local_b58);
            sVar19 = BIO_ctrl(pBVar23,3,0,&ptr);
            iVar6 = (int)local_b50;
            Curl_ssl_push_certinfo_len(pCVar28,(int)local_b50,"Cert",ptr,sVar19);
            BIO_ctrl(pBVar23,1,0,(void *)0x0);
            iVar3 = (int)local_b68;
          }
          BIO_free(local_b48);
          pCVar28 = local_b70;
          cVar43 = (char)local_b38;
        }
      }
    }
    pXVar26 = (X509 *)SSL_get1_peer_certificate(conn->ssl[lVar44].handle);
    conn->ssl[lVar44].server_cert = pXVar26;
    if (pXVar26 == (X509 *)0x0) {
      BIO_free((BIO *)local_b10);
      if (cVar43 != '\0') {
        Curl_failf(pCVar28,"SSL: couldn\'t get peer certificate!");
        return CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    else {
      local_b38 = (Curl_easy *)CONCAT71(local_b38._1_7_,cVar43);
      if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
        pcVar35 = "Proxy";
        if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
          pcVar35 = "Server";
        }
      }
      else {
        pcVar35 = "Server";
      }
      Curl_infof(pCVar28,"%s certificate:\n",pcVar35);
      pXVar18 = X509_get_subject_name((X509 *)conn->ssl[lVar44].server_cert);
      iVar3 = x509_name_oneline((X509_NAME *)pXVar18,error_buffer_1,size);
      pcVar35 = "[NONE]";
      if (iVar3 == 0) {
        pcVar35 = error_buffer_1;
      }
      Curl_infof(pCVar28," subject: %s\n",pcVar35);
      pAVar25 = (ASN1_TIME *)X509_get0_notBefore(conn->ssl[lVar44].server_cert);
      pXVar30 = local_b10;
      ASN1_TIME_print((BIO *)local_b10,pAVar25);
      lVar34 = BIO_ctrl((BIO *)pXVar30,3,0,&local_ac0);
      Curl_infof(pCVar28," start date: %.*s\n",lVar34);
      BIO_ctrl((BIO *)pXVar30,1,0,(void *)0x0);
      pAVar25 = (ASN1_TIME *)X509_get0_notAfter(conn->ssl[lVar44].server_cert);
      ASN1_TIME_print((BIO *)pXVar30,pAVar25);
      lVar34 = BIO_ctrl((BIO *)pXVar30,3,0,&local_ac0);
      local_b70 = pCVar28;
      Curl_infof(pCVar28," expire date: %.*s\n",lVar34);
      BIO_ctrl((BIO *)pXVar30,1,0,(void *)0x0);
      BIO_free((BIO *)pXVar30);
      if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        if ((conn->proxy_ssl_config).verifyhost == true) {
          pXVar30 = (X509 *)conn->ssl[lVar44].server_cert;
          local_b58 = conn->data;
          lVar34 = 0x168;
          lVar32 = 0x160;
LAB_004da5c6:
          local_b08 = *(stack_st_X509 **)((conn->chunk).hexbuffer + lVar32 + -0x20);
          local_b68 = *(undefined8 *)((conn->chunk).hexbuffer + lVar34 + -0x20);
          iVar3 = inet_pton(2,(char *)local_b08,&params);
          local_b48 = (BIO *)CONCAT44(local_b48._4_4_,iVar3);
          pCVar28 = (Curl_easy *)0x0;
          a_00 = (GENERAL_NAMES *)X509_get_ext_d2i(pXVar30,0x55,(int *)0x0,(int *)0x0);
          if (a_00 != (GENERAL_NAMES *)0x0) {
            local_b10 = pXVar30;
            iVar6 = OPENSSL_sk_num(a_00);
            iVar41 = 0;
            bVar45 = false;
            local_b28 = (EVP_PKEY *)0x0;
            local_b50 = (Curl_easy *)0x0;
            local_b00 = (Curl_easy *)0x0;
            while ((iVar41 < iVar6 && (!bVar45))) {
              piVar27 = (int *)OPENSSL_sk_value(a_00,iVar41);
              iVar7 = *piVar27;
              uVar33 = (undefined7)((ulong)pCVar28 >> 8);
              if (iVar7 == 2) {
                pCVar17 = (Curl_easy *)CONCAT71(uVar33,1);
                local_b00 = pCVar17;
              }
              else {
                pCVar17 = pCVar28;
                if (iVar7 == 7) {
                  pCVar17 = (Curl_easy *)CONCAT71(uVar33,1);
                  local_b50 = pCVar17;
                }
              }
              if (iVar7 == (uint)(iVar3 != 0) * 5 + 2) {
                pCVar28 = (Curl_easy *)ASN1_STRING_get0_data(*(undefined8 *)(piVar27 + 2));
                iVar7 = ASN1_STRING_length(*(ASN1_STRING **)(piVar27 + 2));
                if ((curl_socket_t)local_b48 == 0) {
                  sVar29 = strlen((char *)pCVar28);
                  if ((sVar29 != (long)iVar7) ||
                     (iVar7 = Curl_cert_hostcheck((char *)pCVar28,(char *)local_b08), iVar7 == 0))
                  goto LAB_004da739;
                  Curl_infof(local_b58," subjectAltName: host \"%s\" matched cert\'s \"%s\"\n",
                             local_b68);
                  bVar45 = true;
                }
                else {
                  if ((iVar7 != 4) || (iVar7 = bcmp(pCVar28,&params,(long)iVar7), iVar7 != 0))
                  goto LAB_004da739;
                  bVar45 = false;
                  Curl_infof(local_b58," subjectAltName: host \"%s\" matched cert\'s IP address!\n",
                             local_b68);
                  local_b28 = (EVP_PKEY *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                  pCVar28 = pCVar17;
                }
              }
              else {
LAB_004da739:
                pCVar28 = pCVar17;
                bVar45 = false;
              }
              iVar41 = iVar41 + 1;
            }
            GENERAL_NAMES_free(a_00);
            pCVar28 = local_b58;
            uVar20 = local_b68;
            if (bVar45 || ((ulong)local_b28 & 1) != 0) goto LAB_004db4ae;
            pXVar30 = local_b10;
            if ((((byte)local_b00 | (byte)local_b50) & 1) == 0) goto LAB_004da9b3;
            Curl_infof(local_b58," subjectAltName does not match %s\n",local_b68);
            Curl_failf(pCVar28,
                       "SSL: no alternative certificate subject name matches target host name \'%s\'"
                       ,uVar20);
LAB_004da9a5:
            CStack_ba0 = CURLE_PEER_FAILED_VERIFICATION;
            goto LAB_004db709;
          }
LAB_004da9b3:
          error_buffer._0_8_ = (long)"PK\x01\x02" + 4;
          pXVar18 = X509_get_subject_name(pXVar30);
          if (pXVar18 == (X509_NAME *)0x0) {
LAB_004db40a:
            if ((char *)error_buffer._0_8_ == "") {
              error_buffer[0] = '\0';
              error_buffer[1] = '\0';
              error_buffer[2] = '\0';
              error_buffer[3] = '\0';
              error_buffer[4] = '\0';
              error_buffer[5] = '\0';
              error_buffer[6] = '\0';
              error_buffer[7] = '\0';
              goto LAB_004db46b;
            }
            if (error_buffer._0_8_ == 0) goto LAB_004db46b;
            iVar3 = Curl_cert_hostcheck((char *)error_buffer._0_8_,(char *)local_b08);
            if (iVar3 == 0) {
              Curl_failf(local_b58,
                         "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                         ,error_buffer._0_8_);
              goto LAB_004db47e;
            }
            CStack_ba0 = CURLE_OK;
            Curl_infof(local_b58," common name: %s (matched)\n");
          }
          else {
            iVar3 = -1;
            do {
              iVar6 = iVar3;
              iVar3 = X509_NAME_get_index_by_NID(pXVar18,0xd,iVar6);
            } while (-1 < iVar3);
            if (iVar6 < 0) goto LAB_004db40a;
            ne = X509_NAME_get_entry(pXVar18,iVar6);
            pAVar22 = X509_NAME_ENTRY_get_data(ne);
            if (pAVar22 == (ASN1_STRING *)0x0) goto LAB_004db40a;
            iVar3 = ASN1_STRING_type(pAVar22);
            if (iVar3 == 0xc) {
              uVar8 = ASN1_STRING_length(pAVar22);
              if ((int)uVar8 < 0) {
                pcVar35 = "";
              }
              else {
                pcVar35 = (char *)CRYPTO_malloc(uVar8 + 1,
                                                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmcurl/lib/vtls/openssl.c"
                                                ,0x4f7);
                error_buffer._0_8_ = pcVar35;
                if (pcVar35 == (char *)0x0) goto LAB_004db46b;
                __src = (void *)ASN1_STRING_get0_data(pAVar22);
                memcpy(pcVar35,__src,(ulong)uVar8);
                pcVar35[uVar8] = '\0';
              }
LAB_004db3f2:
              sVar29 = strlen(pcVar35);
              uVar9 = curlx_uztosi(sVar29);
              if (uVar9 == uVar8) goto LAB_004db40a;
              Curl_failf(local_b58,"SSL: illegal cert name field");
              if ((char *)error_buffer._0_8_ == "") goto LAB_004da9a5;
              CStack_ba0 = CURLE_PEER_FAILED_VERIFICATION;
              goto LAB_004db48f;
            }
            uVar8 = ASN1_STRING_to_UTF8((uchar **)error_buffer,pAVar22);
            pcVar35 = (char *)error_buffer._0_8_;
            if (error_buffer._0_8_ != 0) goto LAB_004db3f2;
LAB_004db46b:
            Curl_failf(local_b58,"SSL: unable to obtain common name from peer certificate");
LAB_004db47e:
            CStack_ba0 = CURLE_PEER_FAILED_VERIFICATION;
          }
LAB_004db48f:
          if (error_buffer._0_8_ != 0) {
            CRYPTO_free((void *)error_buffer._0_8_);
          }
          if (CStack_ba0 != CURLE_OK) goto LAB_004db709;
        }
      }
      else if ((conn->ssl_config).verifyhost != false) {
        pXVar30 = (X509 *)conn->ssl[lVar44].server_cert;
        local_b58 = conn->data;
        lVar34 = 0xe0;
        lVar32 = 0xd8;
        goto LAB_004da5c6;
      }
LAB_004db4ae:
      pXVar18 = X509_get_issuer_name((X509 *)conn->ssl[lVar44].server_cert);
      iVar3 = x509_name_oneline((X509_NAME *)pXVar18,error_buffer_1,size_00);
      pCVar28 = local_b70;
      if (iVar3 == 0) {
        Curl_infof(local_b70," issuer: %s\n",error_buffer_1);
        if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
           (pCVar28 = local_b70,
           conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          pcVar35 = (local_b70->set).proxy_ssl.issuercert;
        }
        else {
          pcVar35 = (pCVar28->set).ssl.issuercert;
        }
        if (pcVar35 != (char *)0x0) {
          fp = fopen64(pcVar35,"r");
          if (fp == (FILE *)0x0) {
            if ((char)local_b38 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar34 = 0x528,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar34 = 0x478;
              }
              Curl_failf(local_b70,"SSL: Unable to open issuer cert (%s)",
                         *(undefined8 *)((long)local_b70->sockets + lVar34 + -0x80));
            }
            pXVar30 = (X509 *)conn->ssl[lVar44].server_cert;
LAB_004db8cd:
            X509_free(pXVar30);
            conn->ssl[lVar44].server_cert = (X509 *)0x0;
            return CURLE_SSL_ISSUER_ERROR;
          }
          pXVar30 = PEM_read_X509(fp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
          if (pXVar30 == (X509 *)0x0) {
            if ((char)local_b38 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar34 = 0x528,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar34 = 0x478;
              }
              Curl_failf(local_b70,"SSL: Unable to read issuer cert (%s)",
                         *(undefined8 *)((long)local_b70->sockets + lVar34 + -0x80));
            }
            X509_free((X509 *)conn->ssl[lVar44].server_cert);
            X509_free((X509 *)0x0);
            fclose(fp);
            return CURLE_SSL_ISSUER_ERROR;
          }
          fclose(fp);
          iVar3 = X509_check_issued(pXVar30,(X509 *)conn->ssl[lVar44].server_cert);
          pCVar28 = local_b70;
          if (iVar3 != 0) {
            if ((char)local_b38 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar34 = 0x528,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar34 = 0x478;
              }
              Curl_failf(local_b70,"SSL: Certificate issuer check failed (%s)",
                         *(undefined8 *)((long)local_b70->sockets + lVar34 + -0x80));
            }
            X509_free((X509 *)conn->ssl[lVar44].server_cert);
            goto LAB_004db8cd;
          }
          if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar34 = 0x528, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar34 = 0x478;
          }
          Curl_infof(local_b70," SSL certificate issuer check ok (%s)\n",
                     *(undefined8 *)((long)local_b70->sockets + lVar34 + -0x80));
          X509_free(pXVar30);
        }
        lVar34 = SSL_get_verify_result((SSL *)conn->ssl[lVar44].handle);
        *(long *)((long)pCVar28->sockets + local_b20 + -0x80) = lVar34;
        if (lVar34 == 0) {
          local_b60 = (ulong)local_b60._4_4_ << 0x20;
          Curl_infof(pCVar28," SSL certificate verify ok.\n");
        }
        else {
          if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
             (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
            if ((conn->proxy_ssl_config).verifypeer == false) {
LAB_004dbbcc:
              pcVar35 = X509_verify_cert_error_string(lVar34);
              local_b60 = local_b60 & 0xffffffff00000000;
              Curl_infof(local_b70," SSL certificate verify result: %s (%ld), continuing anyway.\n",
                         pcVar35,lVar34);
              goto LAB_004db4e8;
            }
          }
          else if ((conn->ssl_config).verifypeer != true) goto LAB_004dbbcc;
          local_b60 = CONCAT44(local_b60._4_4_,0x33);
          if ((char)local_b38 != '\0') {
            pcVar35 = X509_verify_cert_error_string(lVar34);
            Curl_failf(local_b70,"SSL certificate verify result: %s (%ld)",pcVar35,lVar34);
          }
        }
      }
      else if ((char)local_b38 != '\0') {
        Curl_failf(local_b70,"SSL: couldn\'t get X509-issuer name!");
      }
LAB_004db4e8:
      cVar4 = (conn->http_proxy).proxytype;
      if ((cVar4 == CURLPROXY_HTTPS) &&
         (iVar3 = conn->sock[1], conn->proxy_ssl[iVar3 != -1].state != ssl_connection_complete)) {
        if ((conn->proxy_ssl_config).verifystatus != false) {
LAB_004db58a:
          pCVar28 = conn->data;
          lVar34 = SSL_ctrl((SSL *)conn->ssl[lVar44].handle,0x46,0,error_buffer);
          if (error_buffer._0_8_ == 0) {
            pcVar35 = "No OCSP response received";
LAB_004db6eb:
            resp = (OCSP_RESPONSE *)0x0;
LAB_004db6ee:
            Curl_failf(pCVar28,pcVar35);
LAB_004db6f8:
            CStack_ba0 = CURLE_SSL_INVALIDCERTSTATUS;
          }
          else {
            resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)error_buffer,lVar34);
            if (resp == (OCSP_RESPONSE *)0x0) {
              pcVar35 = "Invalid OCSP response";
              goto LAB_004db6eb;
            }
            uVar8 = OCSP_response_status(resp);
            if (uVar8 != 0) {
              pcVar35 = OCSP_response_status_str((long)(int)uVar8);
              Curl_failf(pCVar28,"Invalid OCSP response status: %s (%d)",pcVar35,(ulong)uVar8);
              goto LAB_004db6f8;
            }
            bs = OCSP_response_get1_basic(resp);
            if (bs == (OCSP_BASICRESP *)0x0) {
              pcVar35 = "Invalid OCSP response";
              goto LAB_004db6ee;
            }
            psVar16 = SSL_get_peer_cert_chain((SSL *)conn->ssl[lVar44].handle);
            st = SSL_CTX_get_cert_store((SSL_CTX *)conn->ssl[lVar44].ctx);
            iVar3 = OCSP_basic_verify(bs,psVar16,st,0);
            if (iVar3 < 1) {
              Curl_failf(pCVar28,"OCSP response verification failed");
              CStack_ba0 = CURLE_SSL_INVALIDCERTSTATUS;
            }
            else {
              for (iVar3 = 0; iVar6 = OCSP_resp_count(bs), iVar3 < iVar6; iVar3 = iVar3 + 1) {
                single = OCSP_resp_get0(bs,iVar3);
                if (single != (OCSP_SINGLERESP *)0x0) {
                  uVar8 = OCSP_single_get0_status
                                    (single,(int *)&addr,(ASN1_GENERALIZEDTIME **)&params,
                                     (ASN1_GENERALIZEDTIME **)&x509,(ASN1_GENERALIZEDTIME **)&ptr);
                  iVar6 = OCSP_check_validity((ASN1_GENERALIZEDTIME *)x509,
                                              (ASN1_GENERALIZEDTIME *)ptr,300,-1);
                  if (iVar6 == 0) {
                    Curl_failf(pCVar28,"OCSP response has expired");
                  }
                  else {
                    pcVar35 = OCSP_cert_status_str((long)(int)uVar8);
                    Curl_infof(pCVar28,"SSL certificate status: %s (%d)\n",pcVar35,(ulong)uVar8);
                    if (uVar8 != 2) {
                      if (uVar8 != 1) goto LAB_004db9bb;
                      pcVar35 = OCSP_crl_reason_str((long)(int)addr.s_addr);
                      Curl_failf(pCVar28,"SSL certificate revocation reason: %s (%d)",pcVar35,
                                 (ulong)_addr & 0xffffffff);
                    }
                  }
                  CStack_ba0 = CURLE_SSL_INVALIDCERTSTATUS;
                  goto LAB_004dbdb9;
                }
LAB_004db9bb:
              }
              CStack_ba0 = CURLE_OK;
            }
LAB_004dbdb9:
            OCSP_BASICRESP_free(bs);
          }
          OCSP_RESPONSE_free(resp);
          if (CStack_ba0 != CURLE_OK) {
LAB_004db709:
            X509_free((X509 *)conn->ssl[lVar44].server_cert);
            conn->ssl[lVar44].server_cert = (X509 *)0x0;
            return CStack_ba0;
          }
          cVar4 = (conn->http_proxy).proxytype;
          local_b60 = local_b60 & 0xffffffff00000000;
          goto LAB_004db730;
        }
        CVar5 = CURLE_OK;
        if ((char)local_b38 != '\0') {
          CVar5 = (CURLcode)local_b60;
        }
LAB_004db74f:
        lVar34 = (ulong)(conn->proxy_ssl[iVar3 != -1].state != ssl_connection_complete) * 8 + 0x718;
      }
      else {
        if ((conn->ssl_config).verifystatus == true) goto LAB_004db58a;
LAB_004db730:
        CVar5 = CURLE_OK;
        if ((char)local_b38 != '\0') {
          CVar5 = (CURLcode)local_b60;
        }
        lVar34 = 0x718;
        if (cVar4 == CURLPROXY_HTTPS) {
          iVar3 = conn->sock[1];
          goto LAB_004db74f;
        }
      }
      pcVar35 = *(char **)((long)local_b70->sockets + lVar34 + -0x80);
      local_ac0 = pcVar35;
      if ((CVar5 == CURLE_OK) && (pcVar35 != (char *)0x0)) {
        pXVar26 = conn->ssl[lVar44].server_cert;
        if (pXVar26 == (X509 *)0x0) {
LAB_004db83b:
          CVar5 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
        }
        else {
          pXVar31 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar26);
          uVar8 = i2d_X509_PUBKEY(pXVar31,(uchar **)0x0);
          if ((int)uVar8 < 1) goto LAB_004db83b;
          uVar14 = (ulong)uVar8;
          pubkey = (uchar *)(*Curl_cmalloc)(uVar14);
          error_buffer._0_8_ = pubkey;
          if (pubkey == (uchar *)0x0) goto LAB_004db83b;
          pXVar31 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar26);
          uVar9 = i2d_X509_PUBKEY(pXVar31,(uchar **)error_buffer);
          if ((error_buffer._0_8_ == 0 || uVar8 != uVar9) ||
              error_buffer._0_8_ - (long)pubkey != uVar14) {
            CVar5 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          }
          else {
            CVar5 = Curl_pin_peer_pubkey(local_b70,pcVar35,pubkey,uVar14);
          }
          (*Curl_cfree)(pubkey);
          if (CVar5 == CURLE_OK) {
            CVar5 = CURLE_OK;
            goto LAB_004db857;
          }
        }
        Curl_failf(local_b70,"SSL: public key does not match pinned public key!");
      }
LAB_004db857:
      X509_free((X509 *)conn->ssl[lVar44].server_cert);
      conn->ssl[lVar44].server_cert = (X509 *)0x0;
      conn->ssl[lVar44].connecting_state = ssl_connect_done;
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
    }
  }
  else if (sVar42 != ssl_connect_done) {
    _Var2 = false;
    goto LAB_004d9671;
  }
  conn->ssl[lVar44].state = ssl_connection_complete;
  conn->recv[lVar44] = ossl_recv;
  conn->send[lVar44] = ossl_send;
  _Var2 = true;
LAB_004d9671:
  *done = _Var2;
  conn->ssl[lVar44].connecting_state = ssl_connect_1;
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  time_t timeout_ms;
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}